

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

string * __thiscall
Vault::
Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::toString(string *__return_storage_ptr__,
          Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  ostringstream ss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string toString() const {
    std::ostringstream ss;
    ss << value();
    return ss.str();
  }